

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O1

void __thiscall
wasm::(anonymous_namespace)::GlobalUseScanner::readsGlobalOnlyToWriteIt(wasm::Expression*,wasm::
Expression*)::FlowScanner::visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  size_type *psVar1;
  Expression *ast;
  Expression *pEVar2;
  long lVar3;
  int iVar4;
  Expression **ppEVar5;
  ulong uVar6;
  undefined8 *puVar7;
  size_t sVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long lVar11;
  Name NVar12;
  undefined1 local_1b8 [8];
  EffectAnalyzer parentEffects;
  
  if ((curr->_id == GlobalGetId) && (curr[1].type.id == *(uintptr_t *)((long)this + 0x158))) {
    ppEVar5 = SmallVector<wasm::Expression_*,_10UL>::back
                        ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
    if (*ppEVar5 != curr) {
      __assert_fail("expressionStack.back() == get",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SimplifyGlobals.cpp"
                    ,0xd9,
                    "void wasm::(anonymous namespace)::GlobalUseScanner::readsGlobalOnlyToWriteIt(Expression *, Expression *)::FlowScanner::visitExpression(Expression *)"
                   );
    }
    iVar4 = (int)((ulong)(*(long *)((long)this + 0x138) - *(long *)((long)this + 0x130)) >> 3) +
            (int)*(undefined8 *)((long)this + 0xd8);
    if (1 < iVar4) {
      uVar6 = (ulong)(iVar4 - 2);
      puVar10 = (undefined8 *)((long)this + uVar6 * 8 + 0xe0);
      sVar8 = uVar6 + 1;
      lVar11 = uVar6 * 8 + -0x50;
      do {
        puVar7 = (undefined8 *)(*(long *)((long)this + 0x130) + lVar11);
        puVar9 = puVar7;
        if (sVar8 - 1 < 10) {
          puVar9 = puVar10;
        }
        ast = (Expression *)*puVar9;
        if (sVar8 - 1 < 9) {
          puVar7 = puVar10;
        }
        pEVar2 = (Expression *)puVar7[1];
        lVar3 = *(long *)((long)this + 0x160);
        parentEffects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)this + 0x168);
        local_1b8[0] = *(undefined1 *)(lVar3 + 0x20);
        local_1b8[1] = *(byte *)(lVar3 + 0x21);
        parentEffects._0_8_ = *(undefined8 *)(lVar3 + 0x98);
        parentEffects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = *(element_type **)(lVar3 + 0xa0);
        if (parentEffects.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar1 = &((parentEffects.funcEffectsMap.
                        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_M_h)._M_bucket_count;
            *(int *)psVar1 = (int)*psVar1 + 1;
            UNLOCK();
          }
          else {
            psVar1 = &((parentEffects.funcEffectsMap.
                        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_M_h)._M_bucket_count;
            *(int *)psVar1 = (int)*psVar1 + 1;
          }
        }
        parentEffects.module._0_4_ =
             parentEffects.funcEffectsMap.
             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi[0x10]._M_use_count;
        parentEffects.module._4_2_ = 0;
        parentEffects.localsRead._M_t._M_impl._0_4_ = 0;
        parentEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        parentEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        parentEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&parentEffects.localsRead;
        parentEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        parentEffects.localsWritten._M_t._M_impl._0_4_ = 0;
        parentEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        parentEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        parentEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&parentEffects.localsWritten;
        parentEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        parentEffects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
        parentEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_red;
        parentEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        parentEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&parentEffects.mutableGlobalsRead;
        parentEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        parentEffects.globalsWritten._M_t._M_impl._0_4_ = 0;
        parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&parentEffects.globalsWritten;
        parentEffects.breakTargets._M_t._M_impl._0_4_ = 0;
        parentEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        parentEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        parentEffects.writesTable = false;
        parentEffects.readsTable = false;
        parentEffects.readsMemory = false;
        parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = '\0';
        parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = '\0';
        parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = '\0';
        parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = '\0';
        parentEffects.trap = false;
        parentEffects.implicitTrap = false;
        parentEffects.isAtomic = false;
        parentEffects.throws_ = false;
        parentEffects._244_4_ = 0;
        parentEffects.tryDepth = 0;
        parentEffects.catchDepth._0_1_ = '\0';
        parentEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&parentEffects.breakTargets;
        parentEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        parentEffects.delegateTargets._M_t._M_impl._0_4_ = 0;
        parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
        ;
        parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&parentEffects.delegateTargets;
        parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        parentEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             parentEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        parentEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             parentEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        parentEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             parentEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        parentEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             parentEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar8;
        EffectAnalyzer::visit((EffectAnalyzer *)local_1b8,ast);
        if ((((((parentEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                 != (_Base_ptr)0x0) || ((char)parentEffects.catchDepth != '\0')) ||
              (parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
               (_Base_ptr)0x0)) ||
             ((parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_
               != '\0' ||
              (parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_
               != '\0')))) ||
            (((parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_
               != '\0' ||
              ((parentEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_
                != '\0' || (parentEffects.readsTable != false)))) ||
             (parentEffects.module._5_1_ != '\0')))) ||
           ((((parentEffects.writesTable != false ||
              (parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right
               != (_Base_ptr)0x0)) || (parentEffects.module._4_1_ != '\0')) ||
            ((parentEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
              (_Base_ptr)0x0 || ((parentEffects.readsMemory == true && ((local_1b8[1] & 1) == 0)))))
            ))) {
LAB_008ea359:
          *(undefined1 *)((long)this + 0x170) = 0;
LAB_008ea360:
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&parentEffects.breakTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&parentEffects.danglingPop);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&parentEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)&parentEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&parentEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count)
          ;
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&parentEffects.features);
          if (parentEffects.funcEffectsMap.
              super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr == (element_type *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     parentEffects.funcEffectsMap.
                     super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          return;
        }
        if ((ast->_id == IfId) && (*(Expression **)(ast + 1) == pEVar2)) {
          if ((*(long *)(ast + 2) == 0) &&
             (NVar12 = anon_unknown_224::GlobalUseScanner::readsGlobalOnlyToWriteIt
                                 (*(GlobalUseScanner **)((long)this + 0x148),
                                  *(Expression **)(ast + 1),(Expression *)ast[1].type.id),
             NVar12.super_IString.str._M_str == *(char **)((long)this + 0x158))) goto LAB_008ea360;
          goto LAB_008ea359;
        }
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&parentEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&parentEffects.danglingPop);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&parentEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)&parentEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count
                   );
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&parentEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&parentEffects.features);
        if (parentEffects.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     parentEffects.funcEffectsMap.
                     super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
        puVar10 = puVar10 + -1;
        lVar11 = lVar11 + -8;
        sVar8 = parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count - 1;
      } while (sVar8 != 0 &&
               0 < (long)parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count);
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
        if (auto* get = curr->dynCast<GlobalGet>()) {
          if (get->name == writtenGlobal) {
            // We found the get of the global. Check where its value flows to,
            // and how it is used there.
            assert(expressionStack.back() == get);
            for (int i = int(expressionStack.size()) - 2; i >= 0; i--) {
              // Consider one pair of parent->child, and check if the parent
              // causes any problems when the child's value reaches it.
              auto* parent = expressionStack[i];
              auto* child = expressionStack[i + 1];
              EffectAnalyzer parentEffects(passOptions, wasm);
              parentEffects.visit(parent);
              if (parentEffects.hasUnremovableSideEffects()) {
                // The parent has some side effect, and the child's value may
                // be used to determine its manner, so this is dangerous.
                ok = false;
                break;
              }

              if (auto* iff = parent->dynCast<If>()) {
                if (iff->condition == child) {
                  // The child is used to decide what code to run, which is
                  // dangerous: check what effects it causes. If it is a nested
                  // appearance of the pattern, that is one case that we know is
                  // actually safe.
                  if (!iff->ifFalse &&
                      globalUseScanner.readsGlobalOnlyToWriteIt(
                        iff->condition, iff->ifTrue) == writtenGlobal) {
                    // This is safe, and we can stop here: the value does not
                    // flow any further.
                    break;
                  }

                  // Otherwise, we found a problem, and can stop.
                  ok = false;
                  break;
                }
              }
            }
          }
        }
      }